

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Device.H
# Opt level: O0

void __thiscall Fl_Display_Device::~Fl_Display_Device(Fl_Display_Device *this)

{
  Fl_Display_Device *this_local;
  
  ~Fl_Display_Device(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

class FL_EXPORT Fl_Display_Device : public Fl_Surface_Device {
  static Fl_Display_Device *_display; // the platform display device
#ifdef __APPLE__
  friend class Fl_X;
  friend class Fl_Graphics_Driver;
  static bool high_res_window_; //< true when drawing to a window of a retina display (Mac OS X only)
  static bool high_resolution() {return high_res_window_;}
#endif
public:
  static const char *class_id;
  const char *class_name() {return class_id;};
  Fl_Display_Device(Fl_Graphics_Driver *graphics_driver);
  static Fl_Display_Device *display_device();
}